

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O2

void opensshcert_string_list_key_components
               (key_components *kc,strbuf *input,char *title,char *title2)

{
  BinarySource *src_00;
  char *name;
  size_t sVar1;
  size_t ti;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  ptrlen value;
  char *titles [2];
  BinarySource src [1];
  
  sVar4 = input->len;
  src_00 = src;
  src[0].data = input->u;
  src[0].len = sVar4;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  src[0].binarysource_ = src_00;
  titles[0] = title;
  titles[1] = title2;
  sVar1 = 0;
  uVar3 = 0;
  do {
    if (sVar4 == sVar1) {
      return;
    }
    for (lVar2 = 0; 2 - (ulong)(title2 == (char *)0x0) != lVar2; lVar2 = lVar2 + 1) {
      value = BinarySource_get_string(src_00);
      src_00 = src[0].binarysource_;
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) break;
      name = dupprintf("%s_%u",titles[lVar2],uVar3);
      key_components_add_text_pl(kc,name,value);
      safefree(name);
      src_00 = src[0].binarysource_;
    }
    uVar3 = (ulong)((int)uVar3 + 1);
    sVar1 = src_00->pos;
    sVar4 = src_00->len;
  } while( true );
}

Assistant:

static void opensshcert_string_list_key_components(
    key_components *kc, strbuf *input, const char *title, const char *title2)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(input));

    const char *titles[2] = { title, title2 };
    size_t ntitles = (title2 ? 2 : 1);

    unsigned index = 0;
    while (get_avail(src)) {
        for (size_t ti = 0; ti < ntitles; ti++) {
            ptrlen value = get_string(src);
            if (get_err(src))
                break;
            char *name = dupprintf("%s_%u", titles[ti], index);
            key_components_add_text_pl(kc, name, value);
            sfree(name);
        }
        index++;
    }
}